

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void asmjit::v1_14::JitAllocatorImpl_wipeOutBlock
               (JitAllocatorPrivateImpl *impl,JitAllocatorBlock *block)

{
  bool bVar1;
  uint32_t areaSize;
  unsigned_long rangeHint;
  long lVar2;
  ulong uVar3;
  JitAllocatorBlock *in_RSI;
  JitAllocatorOptions *in_RDI;
  size_t spanSize;
  uint8_t *spanPtr;
  size_t rangeEnd;
  size_t rangeStart;
  BitVectorRangeIterator<unsigned_long,_0U> it;
  uint8_t *rwPtr;
  uint32_t granularity;
  JitAllocatorPool *pool;
  JitAllocatorPool *this;
  BitVectorRangeIterator<unsigned_long,_0U> *this_00;
  JitAllocatorBlock *in_stack_ffffffffffffffa0;
  undefined4 local_58;
  uint32_t in_stack_ffffffffffffffac;
  void *in_stack_ffffffffffffffb0;
  BitVectorRangeIterator<unsigned_long,_0U> local_48;
  uint8_t *local_28;
  uint local_1c;
  JitAllocatorPool *local_18;
  JitAllocatorBlock *local_10;
  JitAllocatorOptions *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = JitAllocatorBlock::hasFlag(in_RSI,2);
  if (!bVar1) {
    local_18 = JitAllocatorBlock::pool(local_10);
    bVar1 = Support::test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                      (*local_8,kFillUnusedMemory);
    if (bVar1) {
      VirtMem::protectJitMemory(kReadWrite);
      local_1c = (uint)local_18->granularity;
      local_28 = JitAllocatorBlock::rwPtr(local_10);
      this_00 = (BitVectorRangeIterator<unsigned_long,_0U> *)local_10->_usedBitVector;
      this = local_18;
      areaSize = JitAllocatorBlock::areaSize(local_10);
      JitAllocatorPool::bitWordCountFromAreaSize(this,areaSize);
      BitVectorRangeIterator<unsigned_long,_0U>::BitVectorRangeIterator
                (this_00,(unsigned_long *)this,0x143ad2);
      while( true ) {
        rangeHint = std::numeric_limits<unsigned_long>::max();
        bVar1 = BitVectorRangeIterator<unsigned_long,_0U>::nextRange
                          (&local_48,(size_t *)&stack0xffffffffffffffb0,(size_t *)&local_58,
                           rangeHint);
        if (!bVar1) break;
        in_stack_ffffffffffffffa0 =
             (JitAllocatorBlock *)(local_28 + (long)in_stack_ffffffffffffffb0 * (ulong)local_1c);
        lVar2 = CONCAT44(in_stack_ffffffffffffffac,local_58) - (long)in_stack_ffffffffffffffb0;
        uVar3 = (ulong)local_1c;
        JitAllocatorImpl_fillPattern
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   (size_t)in_stack_ffffffffffffffa0);
        VirtMem::flushInstructionCache(in_stack_ffffffffffffffa0,lVar2 * uVar3);
      }
      VirtMem::protectJitMemory(kReadExecute);
    }
    JitAllocatorBlock::clearBlock(in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

static void JitAllocatorImpl_wipeOutBlock(JitAllocatorPrivateImpl* impl, JitAllocatorBlock* block) noexcept {
  if (block->hasFlag(JitAllocatorBlock::kFlagEmpty))
    return;

  JitAllocatorPool* pool = block->pool();
  if (Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    VirtMem::protectJitMemory(VirtMem::ProtectJitAccess::kReadWrite);

    uint32_t granularity = pool->granularity;
    uint8_t* rwPtr = block->rwPtr();
    BitVectorRangeIterator<Support::BitWord, 0> it(block->_usedBitVector, pool->bitWordCountFromAreaSize(block->areaSize()));

    size_t rangeStart;
    size_t rangeEnd;

    while (it.nextRange(&rangeStart, &rangeEnd)) {
      uint8_t* spanPtr = rwPtr + rangeStart * granularity;
      size_t spanSize = (rangeEnd - rangeStart) * granularity;

      JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
      VirtMem::flushInstructionCache(spanPtr, spanSize);
    }
    VirtMem::protectJitMemory(VirtMem::ProtectJitAccess::kReadExecute);
  }

  block->clearBlock();
}